

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::XFormWidget::drag
          (XFormWidget *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Mode MVar1;
  Axis AVar2;
  HalfedgeElement *pHVar3;
  double dVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar5;
  reference pvVar6;
  Vertex *pVVar7;
  Edge *this_00;
  Face *this_01;
  HalfedgeIter *pHVar8;
  pointer pHVar9;
  VertexIter *pVVar10;
  pointer pVVar11;
  Vector2D local_418;
  Vector3D local_408;
  vector<int,_std::allocator<int>_> local_3f0;
  _List_iterator<CMU462::Halfedge> local_3d8;
  HalfedgeIter h_1;
  vector<int,_std::allocator<int>_> local_3b8;
  _List_iterator<CMU462::Halfedge> local_3a0;
  HalfedgeIter h;
  vector<int,_std::allocator<int>_> local_380;
  allocator<int> local_365;
  int local_364 [3];
  iterator local_358;
  size_type local_350;
  undefined1 local_348 [8];
  vector<int,_std::allocator<int>_> I;
  double dStack_328;
  double local_320;
  Face *f;
  Edge *e;
  Vertex *v;
  vector<int,_std::allocator<int>_> local_2e8;
  undefined1 local_2d0 [8];
  Vector3D c;
  allocator<int> local_2a5;
  int local_2a4 [3];
  iterator local_298;
  size_type local_290;
  undefined1 local_288 [8];
  vector<int,_std::allocator<int>_> I_1;
  undefined8 local_268;
  undefined8 local_260;
  Matrix4x4 local_258;
  Vector4D local_1d8;
  double local_1b8;
  double w;
  double local_1a8;
  double local_1a0;
  double local_198;
  undefined1 local_190 [8];
  Vector4D q;
  double theta;
  int view [4];
  double proj [16];
  double model [16];
  double winZ;
  double winY;
  double winX;
  Vector3D *update;
  Matrix4x4 *modelViewProj_local;
  double dy_local;
  double dx_local;
  double y_local;
  double x_local;
  XFormWidget *this_local;
  
  if ((((this->target).axis != None) && ((this->target).object != (SceneObject *)0x0)) &&
     (((this->target).element != (HalfedgeElement *)0x0 || ((this->objectMode & 1U) != 0)))) {
    update = (Vector3D *)modelViewProj;
    modelViewProj_local = (Matrix4x4 *)dy;
    dy_local = dx;
    dx_local = y;
    y_local = x;
    x_local = (double)this;
    if ((this->objectMode & 1U) == 0) {
      if ((this->mode == Translate) && ((this->target).axis == Center)) {
        pHVar3 = (this->target).element;
        (*pHVar3->_vptr_HalfedgeElement[4])(SUB84(dx,0),dy,pHVar3,modelViewProj);
      }
      else {
        pVVar7 = HalfedgeElement::getVertex((this->target).element);
        this_00 = HalfedgeElement::getEdge((this->target).element);
        this_01 = HalfedgeElement::getFace((this->target).element);
        (**((this->target).element)->_vptr_HalfedgeElement)
                  (&I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
        (this->center).z = local_320;
        (this->center).x =
             (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage;
        (this->center).y = dStack_328;
        local_364[0] = 0;
        local_364[1] = 0;
        local_364[2] = 0;
        local_358 = local_364;
        local_350 = 3;
        std::allocator<int>::allocator(&local_365);
        __l._M_len = local_350;
        __l._M_array = local_358;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_348,__l,&local_365);
        std::allocator<int>::~allocator(&local_365);
        switch((this->target).axis) {
        case X:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_348,0);
          *pvVar6 = 1;
          break;
        case Y:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_348,1);
          *pvVar6 = 1;
          break;
        case Z:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_348,2);
          *pvVar6 = 1;
          break;
        case Center:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_348,2);
          *pvVar6 = 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_348,1);
          *pvVar6 = 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_348,0);
          *pvVar6 = 1;
        }
        if (pVVar7 == (Vertex *)0x0) {
          if (this_00 == (Edge *)0x0) {
            if (this_01 != (Face *)0x0) {
              pHVar8 = Face::halfedge(this_01);
              local_3d8._M_node = pHVar8->_M_node;
              do {
                pHVar9 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_3d8);
                pVVar10 = Halfedge::vertex(pHVar9);
                pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar10);
                std::vector<int,_std::allocator<int>_>::vector
                          (&local_3f0,(vector<int,_std::allocator<int>_> *)local_348);
                Vector3D::Vector3D(&local_408,&this->center);
                directionalTransform
                          (this,&pVVar11->position,&local_3f0,&local_408,y_local,dx_local,dy_local,
                           (double)modelViewProj_local,(Matrix4x4 *)update);
                std::vector<int,_std::allocator<int>_>::~vector(&local_3f0);
                pHVar9 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_3d8);
                pHVar8 = Halfedge::next(pHVar9);
                local_3d8._M_node = pHVar8->_M_node;
                pHVar8 = Face::halfedge(this_01);
                bVar5 = std::operator!=(&local_3d8,pHVar8);
              } while (bVar5);
            }
          }
          else {
            pHVar8 = Edge::halfedge(this_00);
            local_3a0._M_node = pHVar8->_M_node;
            do {
              pHVar9 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_3a0);
              pVVar10 = Halfedge::vertex(pHVar9);
              pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar10);
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_3b8,(vector<int,_std::allocator<int>_> *)local_348);
              Vector3D::Vector3D((Vector3D *)&h_1,&this->center);
              directionalTransform
                        (this,&pVVar11->position,&local_3b8,(Vector3D *)&h_1,y_local,dx_local,
                         dy_local,(double)modelViewProj_local,(Matrix4x4 *)update);
              std::vector<int,_std::allocator<int>_>::~vector(&local_3b8);
              pHVar9 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_3a0);
              pHVar8 = Halfedge::twin(pHVar9);
              local_3a0._M_node = pHVar8->_M_node;
              pHVar8 = Edge::halfedge(this_00);
              bVar5 = std::operator!=(&local_3a0,pHVar8);
            } while (bVar5);
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_380,(vector<int,_std::allocator<int>_> *)local_348);
          Vector3D::Vector3D((Vector3D *)&h,&this->center);
          directionalTransform
                    (this,&pVVar7->position,&local_380,(Vector3D *)&h,y_local,dx_local,dy_local,
                     (double)modelViewProj_local,(Matrix4x4 *)update);
          std::vector<int,_std::allocator<int>_>::~vector(&local_380);
        }
        Vector2D::Vector2D(&local_418,y_local,dx_local);
        (this->clickPosition).x = local_418.x;
        (this->clickPosition).y = local_418.y;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_348);
      }
    }
    else {
      MVar1 = this->mode;
      if (MVar1 == Translate) {
        winX = (double)&((this->target).object)->position;
      }
      else if (MVar1 == Rotate) {
        winX = (double)&((this->target).object)->rotation;
      }
      else if (MVar1 == Scale) {
        winX = (double)&((this->target).object)->scale;
      }
      if (this->mode == Rotate) {
        glGetDoublev(0xba6);
        glGetDoublev(0xba7);
        glGetIntegerv(0xba2);
        gluProject(SUB84((this->center).x,0),(this->center).y,(this->center).z,proj + 0xf,view + 2,
                   &theta,&winY,&winZ,model + 0xf);
        winZ = (double)view[1] - winZ;
        dVar4 = atan2(winZ - dx_local,y_local - winY);
        dVar4 = (dVar4 / 3.141592653589793) * 180.0;
        AVar2 = (this->target).axis;
        if (AVar2 == X) {
          *(double *)winX = dVar4;
        }
        else if (AVar2 == Y) {
          *(double *)((long)winX + 8) = dVar4;
        }
        else if (AVar2 == Z) {
          *(double *)((long)winX + 0x10) = dVar4;
        }
      }
      else if ((this->mode == Translate) && ((this->target).axis == Center)) {
        Vector4D::Vector4D((Vector4D *)local_190,(Vector3D *)winX,1.0);
        Matrix4x4::operator*((Vector4D *)&w,(Matrix4x4 *)update,(Vector4D *)local_190);
        local_190 = (undefined1  [8])w;
        q.x = local_1a8;
        q.y = local_1a0;
        q.z = local_198;
        local_1b8 = local_198;
        Vector4D::operator/=((Vector4D *)local_190,&local_1b8);
        local_190 = (undefined1  [8])(dy_local + (double)local_190);
        q.x = (double)modelViewProj_local + q.x;
        Vector4D::operator*=((Vector4D *)local_190,&local_1b8);
        Matrix4x4::inv(&local_258,(Matrix4x4 *)update);
        Matrix4x4::operator*(&local_1d8,&local_258,(Vector4D *)local_190);
        local_190 = (undefined1  [8])local_1d8.x;
        q.x = local_1d8.y;
        q.y = local_1d8.z;
        q.z = local_1d8.w;
        Vector4D::to3D((Vector3D *)
                       &I_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(Vector4D *)local_190);
        *(pointer *)winX =
             I_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
        *(undefined8 *)((long)winX + 8) = local_268;
        *(undefined8 *)((long)winX + 0x10) = local_260;
      }
      else {
        local_2a4[0] = 0;
        local_2a4[1] = 0;
        local_2a4[2] = 0;
        local_298 = local_2a4;
        local_290 = 3;
        std::allocator<int>::allocator(&local_2a5);
        __l_00._M_len = local_290;
        __l_00._M_array = local_298;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_288,__l_00,&local_2a5);
        std::allocator<int>::~allocator(&local_2a5);
        switch((this->target).axis) {
        case X:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_288,0);
          *pvVar6 = 1;
          break;
        case Y:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_288,1);
          *pvVar6 = 1;
          break;
        case Z:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_288,2);
          *pvVar6 = 1;
          break;
        case Center:
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_288,2);
          *pvVar6 = 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_288,1);
          *pvVar6 = 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_288,0);
          *pvVar6 = 1;
        }
        if (this->mode == Translate) {
          Vector3D::Vector3D((Vector3D *)local_2d0,&this->center);
        }
        else {
          Vector3D::Vector3D((Vector3D *)local_2d0,0.0,0.0,0.0);
        }
        dVar4 = winX;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_2e8,(vector<int,_std::allocator<int>_> *)local_288);
        Vector3D::Vector3D((Vector3D *)&v,(Vector3D *)local_2d0);
        directionalTransform
                  (this,(Vector3D *)dVar4,&local_2e8,(Vector3D *)&v,y_local,dx_local,dy_local,
                   (double)modelViewProj_local,(Matrix4x4 *)update);
        std::vector<int,_std::allocator<int>_>::~vector(&local_2e8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_288);
      }
    }
  }
  return;
}

Assistant:

void XFormWidget::drag( double x, double y, double dx, double dy, const Matrix4x4& modelViewProj )
{
  if (target.axis == Selection::Axis::None) return;
  if (target.object == nullptr) return;
  if (target.element == nullptr && !objectMode) return;

  if (objectMode) {
    Vector3D *update;
    switch (mode) {
      case Mode::Translate:
        update = &target.object->position;
        break;
      case Mode::Scale:
        update = &target.object->scale;
        break;
      case Mode::Rotate:
        update = &target.object->rotation;
        break;
    }

    if (mode == Mode::Rotate) {
      double winX, winY, winZ;
      double model[16], proj[16];
      int view[4];
      glGetDoublev(GL_MODELVIEW_MATRIX, model);
      glGetDoublev(GL_PROJECTION_MATRIX, proj);
      glGetIntegerv(GL_VIEWPORT, view);
      gluProject(center.x, center.y, center.z, model, proj, view, &winX, &winY, &winZ);
      winY = view[3] - winY;
      double theta = atan2(winY - y, x - winX) / PI * 180;
      switch (target.axis) {
        case Selection::Axis::X:
          update->x = theta;
          break;
        case Selection::Axis::Y:
          update->y = theta;
          break;
        case Selection::Axis::Z:
          update->z = theta;
          break;
        }
    }
    else if (mode == Mode::Translate &&
        target.axis == Selection::Axis::Center) {        
      Vector4D q( *update, 1. );
      q = modelViewProj * q; 
      double w = q.w;
      q /= w;
      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;
      // Transform back into model s*updateace
      q *= w;
      q = modelViewProj.inv() * q;
      *update = q.to3D();
    }
    else
    {
      vector<int> I = { 0, 0, 0 };
      switch (target.axis)
      {
      case Selection::Axis::X:
        I[0] = 1;
        break;
      case Selection::Axis::Y:
        I[1] = 1;
        break;
      case Selection::Axis::Z:
        I[2] = 1;
        break;
      case Selection::Axis::Center:
        I[0] = I[1] = I[2] = 1;
        break;
      default:
        break;
      }
      Vector3D c = mode == Mode::Translate ? center : Vector3D(0, 0, 0);
      directionalTransform(*update, I, c, x, y, dx, dy, modelViewProj);
    }

    return;
  }

   if( mode == Mode::Translate &&
       target.axis == Selection::Axis::Center )
   {
      target.element->translate( dx, dy, modelViewProj );
      // TODO uniform scale, free rotate
      return;
   }

   Vertex* v = target.element->getVertex();
   Edge*   e = target.element->getEdge();
   Face*   f = target.element->getFace();

   center = target.element->centroid();

   vector<int> I = { 0, 0, 0 };
   switch( target.axis )
   {
      case Selection::Axis::X:
         I[0] = 1;
         break;
      case Selection::Axis::Y:
         I[1] = 1;
         break;
      case Selection::Axis::Z:
         I[2] = 1;
         break;
      case Selection::Axis::Center:
         I[0] = I[1] = I[2] = 1;
         break;
      default:
         break;
   }

   if( v )
   {
      directionalTransform( v->position, I, center, x, y, dx, dy, modelViewProj );
   }
   else if( e )
   {
      HalfedgeIter h = e->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->twin();
      }
      while( h != e->halfedge() );
   }
   else if( f )
   {
      HalfedgeIter h = f->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->next();
      }
      while( h != f->halfedge() );
   }

   clickPosition = Vector2D(x,y);
}